

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O0

bool __thiscall
iDynTree::SubModelDecomposition::splitModelAlongJoints
          (SubModelDecomposition *this,Model *model,Traversal *fullModelTraversal,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *splitJoints)

{
  pointer ppIVar1;
  pointer piVar2;
  __type _Var3;
  bool bVar4;
  uint uVar5;
  pointer piVar6;
  JointIndex JVar7;
  ostream *poVar8;
  const_reference pvVar9;
  reference pvVar10;
  Link *this_00;
  size_type __n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_> *in_RDI;
  size_t subModelIndex;
  IJointConstPtr jointToParent_1;
  LinkConstPtr parentLink;
  Model *in_stack_00000098;
  bool isJointToParentASplitJoint;
  string jointToParentName;
  IJointConstPtr jointToParent;
  bool isLinkBaseOfFullTreeTraversal;
  bool isLinkBaseOfNewSubModel;
  LinkIndex visitedLinkIndex;
  LinkConstPtr visitedLink;
  size_t fullModelTraversalEl;
  size_t newSubModelIndexAvailableToUse;
  size_t duplicateJnt;
  size_t jnt;
  Model *in_stack_fffffffffffffea8;
  Link *in_stack_fffffffffffffeb0;
  Link *in_stack_fffffffffffffeb8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffec0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffec8;
  Traversal *in_stack_fffffffffffffed0;
  vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_> *nrOfSubModels;
  SubModelDecomposition *in_stack_fffffffffffffef0;
  Traversal local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_88.linkIndexToTraversalIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = in_RCX;
  local_18 = in_RSI;
  while( true ) {
    piVar2 = local_88.linkIndexToTraversalIndex.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    piVar6 = (pointer)std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(local_28);
    if (piVar6 <= piVar2) {
      nrOfSubModels = in_RDI + 1;
      Model::getNrOfLinks((Model *)0x46ebce);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffed0,
                 (size_type)in_stack_fffffffffffffec8._M_current);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::size(local_28);
      setNrOfSubModels(in_stack_fffffffffffffef0,(size_t)nrOfSubModels);
      local_88.linkIndexToTraversalIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      for (local_88.toParentJoints.
           super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ppIVar1 = local_88.toParentJoints.
                    super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
          uVar5 = Traversal::getNrOfVisitedLinks((Traversal *)0x46ec2b),
          ppIVar1 < (pointer)(ulong)uVar5;
          local_88.toParentJoints.
          super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)local_88.toParentJoints.
                               super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
        local_88.toParentJoints.
        super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)Traversal::getLink((Traversal *)in_stack_fffffffffffffeb0,
                                         (TraversalIndex)in_stack_fffffffffffffea8);
        local_88.toParentJoints.
        super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)Link::getIndex((Link *)local_88.toParentJoints.
                                             super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish);
        local_88.parents.
        super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        local_88.parents.
        super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ =
             local_88.toParentJoints.
             super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0;
        if ((bool)local_88.parents.
                  super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_) {
          local_88.parents.
          super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        }
        else {
          local_88.parents.
          super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)Traversal::getParentJoint
                                  ((Traversal *)in_stack_fffffffffffffeb0,
                                   (TraversalIndex)in_stack_fffffffffffffea8);
          in_stack_fffffffffffffec8._M_current = local_18;
          (*((IJoint *)
            local_88.parents.
            super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>.
            _M_impl.super__Vector_impl_data._M_finish)->_vptr_IJoint[0x14])();
          in_stack_fffffffffffffed0 = &local_88;
          Model::getJointName_abi_cxx11_(in_stack_00000098,(JointIndex)parentLink);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffea8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffea8);
          std::
          find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                    (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffeb8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffea8);
          bVar4 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)in_stack_fffffffffffffeb0,
                             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)in_stack_fffffffffffffea8);
          if (bVar4) {
            local_88.parents.
            super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
          }
          std::__cxx11::string::~string((string *)&local_88);
        }
        if ((local_88.parents.
             super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
          this_00 = Traversal::getParentLink
                              ((Traversal *)in_stack_fffffffffffffeb0,
                               (TraversalIndex)in_stack_fffffffffffffea8);
          Traversal::getParentJoint
                    ((Traversal *)in_stack_fffffffffffffeb0,
                     (TraversalIndex)in_stack_fffffffffffffea8);
          in_stack_fffffffffffffeb0 = (Link *)(in_RDI + 1);
          __n = Link::getIndex(this_00);
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffffeb0,__n);
          in_stack_fffffffffffffeb8 = (Link *)*pvVar10;
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1)
                               ,(size_type)
                                local_88.toParentJoints.
                                super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          *pvVar10 = (value_type)in_stack_fffffffffffffeb8;
          std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::operator[]
                    (in_RDI,(size_type)in_stack_fffffffffffffeb8);
          Traversal::addTraversalElement
                    (in_stack_fffffffffffffed0,(Link *)in_stack_fffffffffffffec8._M_current,
                     (IJoint *)in_stack_fffffffffffffec0._M_current,in_stack_fffffffffffffeb8);
        }
        else {
          in_stack_fffffffffffffec0._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_88.linkIndexToTraversalIndex.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
          pvVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1)
                               ,(size_type)
                                local_88.toParentJoints.
                                super__Vector_base<const_iDynTree::IJoint_*,_std::allocator<const_iDynTree::IJoint_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          *pvVar10 = (value_type)in_stack_fffffffffffffec0._M_current;
          std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::operator[]
                    (in_RDI,(size_type)
                            local_88.linkIndexToTraversalIndex.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          Traversal::reset((Traversal *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          std::vector<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>::operator[]
                    (in_RDI,(size_type)
                            local_88.linkIndexToTraversalIndex.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          Traversal::addTraversalBase
                    ((Traversal *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
          local_88.linkIndexToTraversalIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_88.linkIndexToTraversalIndex.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + 1);
        }
      }
      return true;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_28,(size_type)
                          local_88.linkIndexToTraversalIndex.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    JVar7 = Model::getJointIndex(in_stack_00000098,(string *)parentLink);
    if (JVar7 == JOINT_INVALID_INDEX) break;
    for (local_88.linkIndexToTraversalIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish = (pointer)0x0;
        piVar2 = local_88.linkIndexToTraversalIndex.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
        piVar6 = (pointer)std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size(local_28), piVar2 < piVar6;
        local_88.linkIndexToTraversalIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)local_88.linkIndexToTraversalIndex.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1)) {
      if (local_88.linkIndexToTraversalIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_88.linkIndexToTraversalIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_28,(size_type)
                              local_88.linkIndexToTraversalIndex.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_28,(size_type)
                              local_88.linkIndexToTraversalIndex.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish);
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffed0,in_stack_fffffffffffffec8._M_current);
        if (_Var3) {
          poVar8 = std::operator<<((ostream *)&std::cerr,
                                   "[ERROR] SubModelDecomposition::splitModelAlongJoints error : ");
          poVar8 = std::operator<<(poVar8," the joint ");
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_28,(size_type)
                                         local_88.linkIndexToTraversalIndex.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage);
          poVar8 = std::operator<<(poVar8,(string *)pvVar9);
          poVar8 = std::operator<<(poVar8," is both the element ");
          poVar8 = (ostream *)
                   std::ostream::operator<<
                             (poVar8,(ulong)local_88.linkIndexToTraversalIndex.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage);
          poVar8 = std::operator<<(poVar8," and ");
          poVar8 = (ostream *)
                   std::ostream::operator<<
                             (poVar8,(ulong)local_88.linkIndexToTraversalIndex.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish);
          poVar8 = std::operator<<(poVar8," of the splitJoints list,");
          poVar8 = std::operator<<(poVar8," please check the list of joints.");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          return false;
        }
      }
    }
    local_88.linkIndexToTraversalIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)local_88.linkIndexToTraversalIndex.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1);
  }
  poVar8 = std::operator<<((ostream *)&std::cerr,
                           "[ERROR] SubModelDecomposition::splitModelAlongJoints error : ");
  poVar8 = std::operator<<(poVar8," requested to split the model along joint ");
  pvVar9 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_28,(size_type)
                                 local_88.linkIndexToTraversalIndex.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
  poVar8 = std::operator<<(poVar8,(string *)pvVar9);
  poVar8 = std::operator<<(poVar8," but no joint with that is in the model. ");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

bool SubModelDecomposition::splitModelAlongJoints(const Model& model,
                                                  const Traversal& fullModelTraversal,
                                                  const std::vector< std::string >& splitJoints)
{
    // first we check that all the splitJoints are actually
    // joints of the model
    for(size_t jnt=0; jnt < splitJoints.size(); jnt++ )
    {
        if( model.getJointIndex(splitJoints[jnt]) == JOINT_INVALID_INDEX )
        {
            std::cerr << "[ERROR] SubModelDecomposition::splitModelAlongJoints error : "
                      << " requested to split the model along joint " << splitJoints[jnt]
                      << " but no joint with that is in the model. " << std::endl;
            return false;
        }

        // Check for duplicates (while it would be possible to handle duplicates,
        // duplicates are tipically associated with some error in the input parameters)
        // O(n^2) solution for checking the duplicates, it can be improved but this simple solution
        // should work fine for tipical uses cases
        for (size_t duplicateJnt=0; duplicateJnt < splitJoints.size(); duplicateJnt++ )
        {
            if (duplicateJnt != jnt && splitJoints[jnt] == splitJoints[duplicateJnt])
            {
                std::cerr << "[ERROR] SubModelDecomposition::splitModelAlongJoints error : "
                          << " the joint " << splitJoints[jnt] << " is both the element "
                          << jnt << " and " << duplicateJnt << " of the splitJoints list,"
                          << " please check the list of joints." << std::endl;
                return false;
            }
        }
    }

    // secondly we check for duplicates

    // The number of link in the decomposition is exactly
    // the number of links in the model
    this->link2subModelIndex.resize(model.getNrOfLinks());

    // we first need to resize the decomposition
    // the number of the submodels is exactly the number of the joints
    // aloing we are dividing the model, plus one
    this->setNrOfSubModels(splitJoints.size()+1);

    // we will assign links to the submodel using a
    // simple scheme: the base of the full tree traversal
    // is assinged to submodel 0. Then we visit the links
    // of the traversal, and we assign a link to the submodel
    // of its parent, unless it is connected to its parent
    // with a joint contained in splitJoints : in that case
    // the link is assigned to a new submodel, and it became
    // the base of the traversal of that submodel .
    size_t newSubModelIndexAvailableToUse = 0;

    for(size_t fullModelTraversalEl=0;
        fullModelTraversalEl < fullModelTraversal.getNrOfVisitedLinks();
        fullModelTraversalEl++)
    {
        LinkConstPtr visitedLink = fullModelTraversal.getLink(fullModelTraversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();

        // the link is assigned to a new subModel if
        // the visited link is the base or if it is connected
        // to its parent with a split joint
        bool isLinkBaseOfNewSubModel = false;
        bool isLinkBaseOfFullTreeTraversal = (fullModelTraversalEl == 0);

        if( isLinkBaseOfFullTreeTraversal )
        {
            isLinkBaseOfNewSubModel = true;
        }
        else
        {
            IJointConstPtr jointToParent = fullModelTraversal.getParentJoint(fullModelTraversalEl);
            std::string jointToParentName = model.getJointName(jointToParent->getIndex());

            bool isJointToParentASplitJoint =
                (std::find(splitJoints.begin(), splitJoints.end(), jointToParentName) != splitJoints.end());

            if( isJointToParentASplitJoint )
            {
                isLinkBaseOfNewSubModel = true;
            }

        }

        if( isLinkBaseOfNewSubModel )
        {
            this->link2subModelIndex[visitedLinkIndex] = newSubModelIndexAvailableToUse;
            this->subModelTraversals[newSubModelIndexAvailableToUse]->reset(model);
            this->subModelTraversals[newSubModelIndexAvailableToUse]->addTraversalBase(visitedLink);

            newSubModelIndexAvailableToUse++;
        }
        else
        {
            // In this case we know that the link has a parent,
            // otherwise it would be a base of the submodel traversal
            LinkConstPtr parentLink = fullModelTraversal.getParentLink(fullModelTraversalEl);
            IJointConstPtr jointToParent = fullModelTraversal.getParentJoint(fullModelTraversalEl);

            size_t subModelIndex = this->link2subModelIndex[visitedLinkIndex]
                                 = this->link2subModelIndex[parentLink->getIndex()];

            this->subModelTraversals[subModelIndex]->addTraversalElement(visitedLink,jointToParent,parentLink);
        }
    }

    return true;
}